

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

int __thiscall QTreeView::indexRowSizeHint(QTreeView *this,QModelIndex *index)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QTreeViewPrivate *pQVar6;
  long *plVar7;
  int *piVar8;
  QModelIndex *in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int logicalColumn;
  int column;
  bool emptyHeader;
  int count;
  int indexRow;
  QTreeViewPrivate *d;
  int hint;
  int max;
  int min;
  QWidget *editor;
  QModelIndex idx;
  int height;
  QModelIndex parent;
  int end;
  int start;
  QStyleOptionViewItem option;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  int local_180;
  int local_178;
  int local_154;
  int local_148;
  QSize local_144;
  int local_13c;
  QSize local_138;
  int local_130;
  undefined8 local_12c;
  int local_124;
  QWidget *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  int local_fc;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  int local_e0;
  int local_dc;
  undefined1 local_d8 [208];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QTreeView *)0x8f07b5);
  bVar2 = QAbstractItemViewPrivate::isIndexValid
                    (in_RDI,(QModelIndex *)
                            CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  if ((bVar2) &&
     (bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractItemDelegate> *)0x8f07e0), bVar2)
     ) {
    local_dc = -1;
    local_e0 = 0xffffffff;
    iVar4 = QModelIndex::row(in_RSI);
    local_178 = QHeaderView::count((QHeaderView *)
                                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    bVar2 = local_178 != 0;
    local_f8 = &DAT_aaaaaaaaaaaaaaaa;
    local_f0 = &DAT_aaaaaaaaaaaaaaaa;
    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::parent((QModelIndex *)in_RDI);
    if ((local_178 == 0) || (bVar3 = QWidget::isVisible((QWidget *)0x8f0888), !bVar3)) {
      pQVar1 = (pQVar6->super_QAbstractItemViewPrivate).model;
      local_178 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,&local_f8);
    }
    else {
      local_dc = QHeaderView::visualIndexAt
                           ((QHeaderView *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                            (int)((ulong)in_RDI >> 0x20));
    }
    bVar3 = QWidget::isRightToLeft((QWidget *)0x8f08d5);
    if (bVar3) {
      if (local_dc == -1) {
        local_dc = local_178 + -1;
      }
      local_e0 = 0;
      in_stack_fffffffffffffe6c = local_dc;
    }
    else {
      if (local_dc == -1) {
        local_dc = 0;
      }
      local_e0 = local_178 + -1;
      in_stack_fffffffffffffe68 = local_dc;
    }
    if (local_e0 < local_dc) {
      qSwap<int>((int *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
    local_fc = -1;
    memset(local_d8,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x8f099f);
    (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                           super_QWidgetPrivate + 0x2f8))(in_RDI,local_d8);
    QRect::setWidth((QRect *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                    in_stack_fffffffffffffe5c);
    for (local_180 = local_dc; local_180 <= local_e0; local_180 = local_180 + 1) {
      iVar5 = local_180;
      if (bVar2) {
        iVar5 = QHeaderView::logicalIndex
                          ((QHeaderView *)
                           CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                           in_stack_fffffffffffffe64);
      }
      in_stack_fffffffffffffe64 = iVar5;
      iVar5 = in_stack_fffffffffffffe64;
      bVar3 = QHeaderView::isSectionHidden
                        ((QHeaderView *)
                         CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe78),
                         (int)((ulong)in_RDI >> 0x20));
      if (!bVar3) {
        local_118 = &DAT_aaaaaaaaaaaaaaaa;
        local_110 = &DAT_aaaaaaaaaaaaaaaa;
        local_108 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar1 = (pQVar6->super_QAbstractItemViewPrivate).model;
        (**(code **)(*(long *)pQVar1 + 0x60))(&local_118,pQVar1,iVar4,iVar5,&local_f8);
        bVar3 = QModelIndex::isValid
                          ((QModelIndex *)
                           CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        if (bVar3) {
          QAbstractItemViewPrivate::editorForIndex
                    ((QAbstractItemViewPrivate *)CONCAT44(iVar5,in_stack_fffffffffffffe78),
                     (QModelIndex *)in_RDI);
          local_120 = QPointer<QWidget>::data((QPointer<QWidget> *)0x8f0ac0);
          if ((local_120 != (QWidget *)0x0) &&
             (bVar3 = QSet<QWidget_*>::contains
                                ((QSet<QWidget_*> *)
                                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                                 (QWidget **)
                                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),
             bVar3)) {
            local_12c = (**(code **)(*(long *)local_120 + 0x70))();
            local_124 = QSize::height((QSize *)0x8f0b16);
            piVar8 = qMax<int>(&local_fc,&local_124);
            local_fc = *piVar8;
            local_138 = QWidget::minimumSize((QWidget *)in_RDI);
            local_130 = QSize::height((QSize *)0x8f0b57);
            local_144 = QWidget::maximumSize((QWidget *)in_RDI);
            local_13c = QSize::height((QSize *)0x8f0b77);
            piVar8 = qBound<int>((int *)in_RDI,
                                 (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68
                                                ),
                                 (int *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60
                                                ));
            local_fc = *piVar8;
          }
          plVar7 = (long *)(**(code **)(*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).
                                                  super_QFramePrivate.super_QWidgetPrivate + 0x208))
                                     (in_RDI,&local_118);
          (**(code **)(*plVar7 + 0x68))(plVar7,local_d8,&local_118);
          local_148 = QSize::height((QSize *)0x8f0bd9);
          piVar8 = qMax<int>(&local_fc,&local_148);
          local_fc = *piVar8;
        }
      }
    }
    local_154 = local_fc;
    QStyleOptionViewItem::~QStyleOptionViewItem
              ((QStyleOptionViewItem *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
              );
  }
  else {
    local_154 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_154;
}

Assistant:

int QTreeView::indexRowSizeHint(const QModelIndex &index) const
{
    Q_D(const QTreeView);
    if (!d->isIndexValid(index) || !d->itemDelegate)
        return 0;

    int start = -1;
    int end = -1;
    int indexRow = index.row();
    int count = d->header->count();
    bool emptyHeader = (count == 0);
    QModelIndex parent = index.parent();

    if (count && isVisible()) {
        // If the sections have moved, we end up checking too many or too few
        start = d->header->visualIndexAt(0);
    } else {
        // If the header has not been laid out yet, we use the model directly
        count = d->model->columnCount(parent);
    }

    if (isRightToLeft()) {
        start = (start == -1 ? count - 1 : start);
        end = 0;
    } else {
        start = (start == -1 ? 0 : start);
        end = count - 1;
    }

    if (end < start)
        qSwap(end, start);

    int height = -1;
    QStyleOptionViewItem option;
    initViewItemOption(&option);
   // ### If we want word wrapping in the items,
    // ### we need to go through all the columns
    // ### and set the width of the column

    // Hack to speed up the function
    option.rect.setWidth(-1);

    for (int column = start; column <= end; ++column) {
        int logicalColumn = emptyHeader ? column : d->header->logicalIndex(column);
        if (d->header->isSectionHidden(logicalColumn))
            continue;
        QModelIndex idx = d->model->index(indexRow, logicalColumn, parent);
        if (idx.isValid()) {
            QWidget *editor = d->editorForIndex(idx).widget.data();
            if (editor && d->persistent.contains(editor)) {
                height = qMax(height, editor->sizeHint().height());
                int min = editor->minimumSize().height();
                int max = editor->maximumSize().height();
                height = qBound(min, height, max);
            }
            int hint = itemDelegateForIndex(idx)->sizeHint(option, idx).height();
            height = qMax(height, hint);
        }
    }

    return height;
}